

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_generated.h
# Opt level: O0

bool __thiscall reflection::KeyValue::Verify(KeyValue *this,Verifier *verifier)

{
  bool bVar1;
  String *pSVar2;
  undefined1 local_19;
  Verifier *verifier_local;
  KeyValue *this_local;
  
  bVar1 = flatbuffers::Table::VerifyTableStart(&this->super_Table,verifier);
  local_19 = false;
  if (bVar1) {
    bVar1 = flatbuffers::Table::VerifyOffsetRequired<unsigned_int>(&this->super_Table,verifier,4);
    local_19 = false;
    if (bVar1) {
      pSVar2 = key(this);
      bVar1 = flatbuffers::VerifierTemplate<false>::VerifyString(verifier,pSVar2);
      local_19 = false;
      if (bVar1) {
        bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>(&this->super_Table,verifier,6);
        local_19 = false;
        if (bVar1) {
          pSVar2 = value(this);
          bVar1 = flatbuffers::VerifierTemplate<false>::VerifyString(verifier,pSVar2);
          local_19 = false;
          if (bVar1) {
            local_19 = flatbuffers::VerifierTemplate<false>::EndTable(verifier);
          }
        }
      }
    }
  }
  return local_19;
}

Assistant:

bool Verify(::flatbuffers::Verifier &verifier) const {
    return VerifyTableStart(verifier) &&
           VerifyOffsetRequired(verifier, VT_KEY) &&
           verifier.VerifyString(key()) &&
           VerifyOffset(verifier, VT_VALUE) &&
           verifier.VerifyString(value()) &&
           verifier.EndTable();
  }